

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_type.c
# Opt level: O0

value type_metadata_impl(type_conflict t)

{
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  value pvVar4;
  undefined4 *in_RDI;
  value in_stack_00000010;
  char *type_name_str;
  value *id_array;
  value *name_array;
  value *v_map;
  value id;
  value name;
  value v;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  char *local_50;
  value local_8;
  
  if (in_RDI == (undefined4 *)0x0) {
    local_50 = "";
  }
  else {
    local_50 = *(char **)(in_RDI + 2);
  }
  pvVar1 = value_create_array((value *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              ,in_stack_ffffffffffffff98);
  if (pvVar1 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    ppvVar2 = value_to_array((value)0x105d9c);
    pvVar3 = value_create_string((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98);
    *ppvVar2 = pvVar3;
    if (*ppvVar2 == (value)0x0) {
      value_type_destroy(in_stack_00000010);
      local_8 = (value)0x0;
    }
    else {
      strlen(local_50);
      pvVar3 = value_create_string((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff98);
      ppvVar2[1] = pvVar3;
      if (ppvVar2[1] == (value)0x0) {
        value_type_destroy(in_stack_00000010);
        local_8 = (value)0x0;
      }
      else {
        pvVar3 = value_create_array((value *)CONCAT44(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0),
                                    in_stack_ffffffffffffff98);
        if (pvVar3 == (value)0x0) {
          value_type_destroy(in_stack_00000010);
          local_8 = (value)0x0;
        }
        else {
          ppvVar2 = value_to_array((value)0x105e6e);
          pvVar4 = value_create_string((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0),
                                       in_stack_ffffffffffffff98);
          *ppvVar2 = pvVar4;
          if (*ppvVar2 == (value)0x0) {
            value_type_destroy(in_stack_00000010);
            value_type_destroy(in_stack_00000010);
            local_8 = (value)0x0;
          }
          else {
            if (in_RDI == (undefined4 *)0x0) {
              uVar5 = 0x14;
            }
            else {
              uVar5 = *in_RDI;
            }
            pvVar4 = value_create_int(0);
            ppvVar2[1] = pvVar4;
            if (ppvVar2[1] == (value)0x0) {
              value_type_destroy(in_stack_00000010);
              value_type_destroy(in_stack_00000010);
              local_8 = (value)0x0;
            }
            else {
              local_8 = value_create_map((value *)CONCAT44(uVar5,in_stack_ffffffffffffffa0),
                                         in_stack_ffffffffffffff98);
              if (local_8 == (value)0x0) {
                value_type_destroy(in_stack_00000010);
                value_type_destroy(in_stack_00000010);
                local_8 = (value)0x0;
              }
              else {
                ppvVar2 = value_to_map((value)0x105f60);
                *ppvVar2 = pvVar1;
                ppvVar2[1] = pvVar3;
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

value type_metadata_impl(type t)
{
	static const char name_str[] = "name";
	static const char id_str[] = "id";

	value v, name, id;
	value *v_map, *name_array, *id_array;

	const char *type_name_str = t != NULL ? t->name : "";

	name = value_create_array(NULL, 2);

	if (name == NULL)
	{
		return NULL;
	}

	name_array = value_to_array(name);

	name_array[0] = value_create_string(name_str, sizeof(name_str) - 1);

	if (name_array[0] == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	name_array[1] = value_create_string(type_name_str, strlen(type_name_str));

	if (name_array[1] == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	id = value_create_array(NULL, 2);

	if (id == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	id_array = value_to_array(id);

	id_array[0] = value_create_string(id_str, sizeof(id_str) - 1);

	if (id_array[0] == NULL)
	{
		value_type_destroy(name);

		value_type_destroy(id);

		return NULL;
	}

	id_array[1] = value_create_int(t != NULL ? (int)t->id : (int)TYPE_INVALID);

	if (id_array[1] == NULL)
	{
		value_type_destroy(name);

		value_type_destroy(id);

		return NULL;
	}

	/* Create type map (type name + type id) */
	v = value_create_map(NULL, 2);

	if (v == NULL)
	{
		value_type_destroy(name);

		value_type_destroy(id);

		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = name;

	v_map[1] = id;

	return v;
}